

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synapse.cxx
# Opt level: O1

string * __thiscall
SimpleSynapse::getParameter(string *__return_storage_ptr__,SimpleSynapse *this,string *name)

{
  int iVar1;
  long lVar2;
  stringstream param;
  stringstream local_1a0 [128];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    lVar2 = 0x168;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      Synapse::getParameter(__return_storage_ptr__,&this->super_Synapse,name);
      goto LAB_0014a5e0;
    }
    lVar2 = 0x160;
  }
  std::ostream::_M_insert<double>
            (*(double *)
              ((long)&(this->super_Synapse).super_StochasticFunction.super_StochasticProcess.
                      super_Parametric._vptr_Parametric + lVar2));
  std::__cxx11::stringbuf::str();
LAB_0014a5e0:
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string SimpleSynapse::getParameter( const string& name ) const
{
	stringstream param;
	if (name == "time-constant")
		param << simpleTimeConstant;
	else if (name == "peak-conductance")
		param << simplePeakCnd;
	else
		return Synapse::getParameter(name);
	
	return param.str();
}